

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_configchg.c
# Opt level: O1

void ares_event_configchg_cb
               (ares_event_thread_t *e,ares_socket_t fd,void *data,ares_event_flags_t flags)

{
  char *str;
  bool bVar1;
  ares_bool_t aVar2;
  ssize_t sVar3;
  size_t sVar4;
  undefined1 *__buf;
  uchar buf [4096];
  undefined1 local_1030 [4096];
  
  bVar1 = false;
  do {
    __buf = local_1030;
    sVar3 = read(*data,__buf,0x1000);
    if (0 < sVar3) {
      do {
        if (*(int *)(__buf + 0xc) != 0) {
          str = __buf + 0x10;
          sVar4 = ares_strlen(str);
          if (sVar4 != 0) {
            aVar2 = ares_strcaseeq(str,"resolv.conf");
            if (aVar2 == ARES_FALSE) {
              aVar2 = ares_strcaseeq(str,"nsswitch.conf");
              if (aVar2 == ARES_FALSE) goto LAB_0011cd36;
            }
            bVar1 = true;
          }
        }
LAB_0011cd36:
        __buf = __buf + (ulong)*(uint *)(__buf + 0xc) + 0x10;
      } while (__buf < local_1030 + sVar3);
    }
    if (sVar3 < 1) {
      if (bVar1) {
        ares_reinit(e->channel);
      }
      return;
    }
  } while( true );
}

Assistant:

static void ares_event_configchg_cb(ares_event_thread_t *e, ares_socket_t fd,
                                    void *data, ares_event_flags_t flags)
{
  const ares_event_configchg_t *configchg = data;

  /* Some systems cannot read integer variables if they are not
   * properly aligned. On other systems, incorrect alignment may
   * decrease performance. Hence, the buffer used for reading from
   * the inotify file descriptor should have the same alignment as
   * struct inotify_event. */
  unsigned char                 buf[4096]
    __attribute__((aligned(__alignof__(struct inotify_event))));
  const struct inotify_event *event;
  ssize_t                     len;
  ares_bool_t                 triggered = ARES_FALSE;

  (void)fd;
  (void)flags;

  while (1) {
    const unsigned char *ptr;

    len = read(configchg->inotify_fd, buf, sizeof(buf));
    if (len <= 0) {
      break;
    }

    /* Loop over all events in the buffer. Says kernel will check the buffer
     * size provided, so I assume it won't ever return partial events. */
    for (ptr  = buf; ptr < buf + len;
         ptr += sizeof(struct inotify_event) + event->len) {
      event = (const struct inotify_event *)((const void *)ptr);

      if (event->len == 0 || ares_strlen(event->name) == 0) {
        continue;
      }

      if (ares_strcaseeq(event->name, "resolv.conf") ||
          ares_strcaseeq(event->name, "nsswitch.conf")) {
        triggered = ARES_TRUE;
      }
    }
  }

  /* Only process after all events are read.  No need to process more often as
   * we don't want to reload the config back to back */
  if (triggered) {
    ares_reinit(e->channel);
  }
}